

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O2

int ASN1_item_i2d(ASN1_VALUE *val,uchar **out,ASN1_ITEM *it)

{
  uint uVar1;
  uint uVar2;
  uchar *orig_ptr;
  ASN1_VALUE *val_local;
  uchar *p;
  
  val_local = (ASN1_VALUE *)val;
  if ((out == (uchar **)0x0) || (*out != (uchar *)0x0)) {
    uVar1 = ASN1_item_ex_i2d((ASN1_VALUE **)&val_local,out,it,-1,0);
  }
  else {
    uVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&val_local,(uchar **)0x0,it,-1,0);
    uVar1 = uVar2;
    if ((0 < (int)uVar2) &&
       (orig_ptr = (uchar *)OPENSSL_malloc((ulong)uVar2), uVar1 = 0xffffffff,
       orig_ptr != (uchar *)0x0)) {
      p = orig_ptr;
      uVar1 = ASN1_item_ex_i2d((ASN1_VALUE **)&val_local,&p,it,-1,0);
      if ((int)uVar1 < 1) {
        OPENSSL_free(orig_ptr);
      }
      else {
        if (uVar2 != uVar1) {
          __assert_fail("len == len2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x3d,"int ASN1_item_i2d(ASN1_VALUE *, unsigned char **, const ASN1_ITEM *)"
                       );
        }
        *out = orig_ptr;
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

int ASN1_item_i2d(ASN1_VALUE *val, unsigned char **out, const ASN1_ITEM *it) {
  if (out && !*out) {
    unsigned char *p, *buf;
    int len = ASN1_item_ex_i2d(&val, NULL, it, /*tag=*/-1, /*aclass=*/0);
    if (len <= 0) {
      return len;
    }
    buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
    if (!buf) {
      return -1;
    }
    p = buf;
    int len2 = ASN1_item_ex_i2d(&val, &p, it, /*tag=*/-1, /*aclass=*/0);
    if (len2 <= 0) {
      OPENSSL_free(buf);
      return len2;
    }
    assert(len == len2);
    *out = buf;
    return len;
  }

  return ASN1_item_ex_i2d(&val, out, it, /*tag=*/-1, /*aclass=*/0);
}